

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void trial::protocol::serialization::
     save_overloader<trial::protocol::json::basic_oarchive<char>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
     ::save(basic_oarchive<char> *ar,variable *data,uint protocol_version)

{
  type_conflict tVar1;
  type_conflict1 tVar2;
  type tVar3;
  bool bVar4;
  type_conflict2 tVar5;
  type_conflict3 tVar6;
  value vVar7;
  type_conflict5 tVar8;
  type_conflict4 tVar9;
  type_conflict7 tVar10;
  const_reference pbVar11;
  type_conflict6 tVar12;
  error *this;
  variable *this_00;
  type_conflict8 tVar13;
  type_conflict9 tVar14;
  const_iterator it;
  const_iterator __end4;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  basic_writer<char,_16UL> *local_50;
  undefined1 local_48 [24];
  
  this_00 = data;
  vVar7 = dynamic::basic_variable<std::allocator<char>_>::code(data);
  switch(vVar7) {
  case null:
    json::basic_writer<char,_16UL>::null_value(&ar->writer);
    return;
  case boolean:
    tVar3 = dynamic::basic_variable<std::allocator<char>_>::value<bool>(data);
    local_78[0] = tVar3;
    json::basic_writer<char,16ul>::value<bool_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(bool *)local_78);
    break;
  case signed_char:
    tVar1 = dynamic::basic_variable<std::allocator<char>_>::value<signed_char>(data);
    local_78[0] = tVar1;
    json::basic_writer<char,16ul>::value<signed_char_const&>
              ((basic_writer<char,16ul> *)&ar->writer,local_78);
    break;
  case unsigned_char:
    tVar2 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>(data);
    local_78[0] = tVar2;
    json::basic_writer<char,16ul>::value<unsigned_char_const&>
              ((basic_writer<char,16ul> *)&ar->writer,local_78);
    break;
  case signed_short_integer:
    tVar5 = dynamic::basic_variable<std::allocator<char>_>::value<short>(data);
    local_78._0_2_ = tVar5;
    json::basic_writer<char,16ul>::value<short_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(short *)local_78);
    break;
  case unsigned_short_integer:
    tVar6 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>(data);
    local_78._0_2_ = tVar6;
    json::basic_writer<char,16ul>::value<unsigned_short_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(unsigned_short *)local_78);
    break;
  case signed_integer:
    tVar9 = dynamic::basic_variable<std::allocator<char>_>::value<int>(data);
    local_78._0_4_ = tVar9;
    json::basic_writer<char,16ul>::value<int_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(int *)local_78);
    break;
  case unsigned_integer:
    tVar8 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>(data);
    local_78._0_4_ = tVar8;
    json::basic_writer<char,16ul>::value<unsigned_int_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(uint *)local_78);
    break;
  case signed_long_integer:
    tVar12 = dynamic::basic_variable<std::allocator<char>_>::value<long>(data);
    local_78._0_8_ = tVar12;
    json::basic_writer<char,16ul>::value<long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(long *)local_78);
    break;
  case unsigned_long_integer:
    tVar10 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>(data);
    local_78._0_8_ = tVar10;
    json::basic_writer<char,16ul>::value<unsigned_long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(unsigned_long *)local_78);
    break;
  case signed_long_long_integer:
    tVar12 = dynamic::basic_variable<std::allocator<char>_>::value<long_long>(data);
    local_78._0_8_ = tVar12;
    json::basic_writer<char,16ul>::value<long_long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(longlong *)local_78);
    break;
  case unsigned_long_long_integer:
    tVar10 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>(data);
    local_78._0_8_ = tVar10;
    json::basic_writer<char,16ul>::value<unsigned_long_long_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(unsigned_long_long *)local_78);
    break;
  case float_number:
    tVar13 = dynamic::basic_variable<std::allocator<char>_>::value<float>(data);
    local_78._0_4_ = tVar13;
    json::basic_writer<char,16ul>::value<float_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(float *)local_78);
    break;
  case double_number:
    tVar14 = dynamic::basic_variable<std::allocator<char>_>::value<double>(data);
    local_78._0_8_ = tVar14;
    json::basic_writer<char,16ul>::value<double_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(double *)local_78);
    break;
  case long_double_number:
    dynamic::basic_variable<std::allocator<char>_>::value<long_double>
              ((type_conflict10 *)data,this_00);
    json::basic_writer<char,16ul>::value<long_double_const&>
              ((basic_writer<char,16ul> *)&ar->writer,(longdouble *)local_78);
    break;
  case string:
    dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
              ((type *)local_78,data);
    json::basic_writer<char,16ul>::value<std::__cxx11::string_const&>
              ((basic_writer<char,16ul> *)&ar->writer,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._0_8_ != &local_68) {
      operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
    }
    break;
  case wstring:
  case u16string:
  case u32string:
    this = (error *)__cxa_allocate_exception(0x20);
    json::error::error(this,incompatible_type);
    __cxa_throw(this,&json::error::typeinfo,std::system_error::~system_error);
  case array:
    json::basic_writer<char,_16UL>::begin_array_value(&ar->writer);
    dynamic::basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     *)local_78,data,true);
    dynamic::basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     *)local_48,data,false);
    while (bVar4 = dynamic::basic_variable<std::allocator<char>_>::
                   iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                   ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                             *)local_78,(const_iterator *)local_48), !bVar4) {
      pbVar11 = dynamic::basic_variable<std::allocator<char>_>::
                iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                ::value((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_78);
      save(ar,pbVar11,protocol_version);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_78);
    }
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                *)(local_48 + 8));
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                *)(local_78 + 8));
    json::basic_writer<char,_16UL>::end_array_value(&ar->writer);
    break;
  case map:
    local_50 = &ar->writer;
    json::basic_writer<char,_16UL>::begin_object_value(local_50);
    dynamic::basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                     *)local_78,data,true);
    while( true ) {
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::iterator_base((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       *)local_48,data,false);
      bVar4 = dynamic::basic_variable<std::allocator<char>_>::
              iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              ::equals((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                        *)local_78,(const_iterator *)local_48);
      dynamic::detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
      ::
      call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
                ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                  *)(local_48 + 8));
      if (bVar4) break;
      pbVar11 = dynamic::basic_variable<std::allocator<char>_>::
                iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                ::key((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       *)local_78);
      save(ar,pbVar11,protocol_version);
      pbVar11 = dynamic::basic_variable<std::allocator<char>_>::
                iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                ::value((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                         *)local_78);
      save(ar,pbVar11,protocol_version);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_78);
    }
    dynamic::detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
    ::
    call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>::destructor,void>
              ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,trial::dynamic::basic_variable<std::allocator<char>>const*,unsigned_char,trial::dynamic::basic_variable<std::allocator<char>>const*,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>const*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,std::_Rb_tree_const_iterator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>
                *)(local_78 + 8));
    json::basic_writer<char,_16UL>::end_object_value(local_50);
  }
  return;
}

Assistant:

static void save(protocol::json::basic_oarchive<CharT>& ar,
                     const dynamic::variable& data,
                     const unsigned int protocol_version)
    {
        switch (data.code())
        {
        case dynamic::code::null:
            ar.template save<json::token::null>();
            break;

        case dynamic::code::boolean:
            ar.save(data.value<bool>());
            break;

        case dynamic::code::signed_char:
            ar.save(data.value<signed char>());
            break;

        case dynamic::code::unsigned_char:
            ar.save(data.value<unsigned char>());
            break;

        case dynamic::code::signed_short_integer:
            ar.save(data.value<signed short int>());
            break;

        case dynamic::code::unsigned_short_integer:
            ar.save(data.value<unsigned short int>());
            break;

        case dynamic::code::signed_integer:
            ar.save(data.value<signed int>());
            break;

        case dynamic::code::unsigned_integer:
            ar.save(data.value<unsigned int>());
            break;

        case dynamic::code::signed_long_integer:
            ar.save(data.value<signed long int>());
            break;

        case dynamic::code::unsigned_long_integer:
            ar.save(data.value<unsigned long int>());
            break;

        case dynamic::code::signed_long_long_integer:
            ar.save(data.value<signed long long int>());
            break;

        case dynamic::code::unsigned_long_long_integer:
            ar.save(data.value<unsigned long long int>());
            break;

        case dynamic::code::real:
            ar.save(data.value<float>());
            break;

        case dynamic::code::long_real:
            ar.save(data.value<double>());
            break;

        case dynamic::code::long_long_real:
            ar.save(data.value<long double>());
            break;

        case dynamic::code::string:
            ar.save(data.value<dynamic::string>());
            break;

        case dynamic::code::wstring:
        case dynamic::code::u16string:
        case dynamic::code::u32string:
            throw json::error(json::incompatible_type);

        case dynamic::code::array:
            ar.template save<json::token::begin_array>();
            for (const auto& item : data)
            {
                ar.save_override(item, protocol_version);
            }
            ar.template save<json::token::end_array>();
            break;

        case dynamic::code::map:
            ar.template save<json::token::begin_object>();
            for (auto it = data.begin(); it != data.end(); ++it)
            {
                ar.save_override(it.key(), protocol_version);
                ar.save_override(it.value(), protocol_version);
            }
            ar.template save<json::token::end_object>();
            break;
        }
    }